

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libxml_reporter_tests.c
# Opt level: O1

xmlNodePtr xmlnode_find_sibling(xmlNodePtr node,char *name)

{
  int iVar1;
  
  if (node != (xmlNodePtr)0x0) {
    do {
      iVar1 = xmlStrEqual(node->name,"failure");
      if (iVar1 != 0) {
        return node;
      }
      node = (xmlNodePtr)xmlNextElementSibling(node);
    } while (node != (xmlNodePtr)0x0);
  }
  return node;
}

Assistant:

static xmlNodePtr xmlnode_find_sibling(xmlNodePtr node, const char *name)
{
    while (node) {
        if (xmlStrEqual(node->name, XMLSTRING(name)))
            break;
        node = xmlNextElementSibling(node);
    }
    return node;
}